

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O3

void Tas_ManDeriveReason(Tas_Man_t *p,int Level)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  undefined8 uVar4;
  uint uVar5;
  void **ppvVar6;
  Gia_Obj_t **ppGVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int local_48;
  
  lVar17 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar17] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2f9,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  lVar17 = lVar17 + 1;
  local_48 = (int)lVar17;
  if ((p->pClauses).iTail <= local_48) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2fa,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  do {
    pGVar2 = (p->pClauses).pData[lVar17];
    if (-1 < *(long *)pGVar2) {
      *(long *)pGVar2 = *(long *)pGVar2 + -0x8000000000000000;
      pVVar9 = p->vTemp;
      uVar5 = pVVar9->nSize;
      if (uVar5 == pVVar9->nCap) {
        if ((int)uVar5 < 0x10) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar9->pArray,0x80);
          }
          pVVar9->pArray = ppvVar6;
          pVVar9->nCap = 0x10;
        }
        else {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar5 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar9->pArray,(ulong)uVar5 << 4);
          }
          pVVar9->pArray = ppvVar6;
          pVVar9->nCap = uVar5 * 2;
        }
      }
      else {
        ppvVar6 = pVVar9->pArray;
      }
      iVar12 = pVVar9->nSize;
      pVVar9->nSize = iVar12 + 1;
      ppvVar6[iVar12] = pGVar2;
      uVar5 = pGVar2->Value;
      if (uVar5 == 0xffffffff) {
LAB_006a03bf:
        __assert_fail("pVar->Value != ~0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                      ,0x83,"int Tas_VarDecLevel(Tas_Man_t *, Gia_Obj_t *)");
      }
      uVar10 = uVar5 * 3;
      if ((int)uVar10 < 0) goto LAB_006a03a0;
      uVar1 = p->vLevReas->nSize;
      if (uVar1 == uVar10 || SBORROW4(uVar1,uVar10) != (int)(uVar1 + uVar5 * -3) < 0)
      goto LAB_006a03a0;
      piVar3 = p->vLevReas->pArray;
      if (piVar3[uVar10] < Level) {
        ppGVar7 = (p->pClauses).pData;
        lVar8 = (long)local_48;
        local_48 = local_48 + 1;
LAB_006a0016:
        ppGVar7[lVar8] = pGVar2;
        goto LAB_006a0338;
      }
      if (piVar3[uVar10] != Level) {
        __assert_fail("iLitLevel == Level",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                      ,0x318,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
      }
      if (uVar1 <= uVar10 + 1) goto LAB_006a03a0;
      iVar12 = piVar3[uVar10 + 1];
      if ((long)iVar12 == 0) {
        if (uVar1 <= uVar10 + 2) goto LAB_006a03a0;
        lVar8 = (long)piVar3[uVar10 + 2];
        if (lVar8 != 0) {
          piVar3 = (p->pStore).pData;
          if (piVar3[lVar8 + 3] < 0) {
LAB_006a03de:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar5 = (uint)piVar3[lVar8 + 3] >> 1;
          if (p->pAig->nObjs <= (int)uVar5) {
LAB_006a03fd:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pAig->pObjs + uVar5 != pGVar2) {
            __assert_fail("pReason == pObj",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x31d,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
          }
          iVar12 = piVar3[lVar8 + 2];
          if (1 < iVar12) {
            lVar15 = 4;
            do {
              uVar5 = piVar3[lVar8 + lVar15];
              if ((int)uVar5 < 0) goto LAB_006a03de;
              uVar10 = uVar5 >> 1;
              if (p->pAig->nObjs <= (int)uVar10) goto LAB_006a03fd;
              pGVar2 = p->pAig->pObjs;
              uVar1 = pGVar2[uVar10].Value;
              if (uVar1 == 0xffffffff) goto LAB_006a03bf;
              iVar14 = uVar1 * 3;
              if ((iVar14 < 0) ||
                 (iVar13 = p->vLevReas->nSize,
                 iVar13 == iVar14 || SBORROW4(iVar13,iVar14) != (int)(iVar13 + uVar1 * -3) < 0))
              goto LAB_006a03a0;
              pGVar2 = pGVar2 + uVar10;
              uVar4 = *(undefined8 *)pGVar2;
              if (((uint)uVar4 >> 0x1e & 1) == 0) {
                __assert_fail("Tas_VarIsAssigned( pReason )",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                              ,0x322,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
              }
              if ((((uint)((ulong)uVar4 >> 0x3e) ^ uVar5) & 1) != 0) {
                __assert_fail("!Tas_LitIsTrue( pReason, pCls->pLits[j] )",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                              ,0x323,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
              }
              iVar14 = (p->pClauses).iTail;
              if (iVar14 == (p->pClauses).nSize) {
                (p->pClauses).nSize = iVar14 * 2;
                ppGVar7 = (p->pClauses).pData;
                if (ppGVar7 == (Gia_Obj_t **)0x0) {
                  ppGVar7 = (Gia_Obj_t **)malloc((long)iVar14 << 4);
                }
                else {
                  ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,(long)iVar14 << 4);
                  iVar14 = (p->pClauses).iTail;
                  iVar12 = piVar3[lVar8 + 2];
                }
                (p->pClauses).pData = ppGVar7;
              }
              else {
                ppGVar7 = (p->pClauses).pData;
              }
              (p->pClauses).iTail = iVar14 + 1;
              ppGVar7[iVar14] = pGVar2;
              lVar16 = lVar15 + -2;
              lVar15 = lVar15 + 1;
            } while (lVar16 < iVar12);
          }
          goto LAB_006a0338;
        }
        ppGVar7 = (p->pClauses).pData;
        lVar8 = (long)(p->pClauses).iHead;
        if ((Level != 0) && (ppGVar7[lVar8] != (Gia_Obj_t *)0x0)) {
          __assert_fail("pQue->pData[pQue->iHead] == NULL || Level == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x32c,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
        }
        if (ppGVar7[lVar8] != (Gia_Obj_t *)0x0) {
          iVar12 = (p->pClauses).iTail;
          if (iVar12 == (p->pClauses).nSize) {
            (p->pClauses).nSize = iVar12 * 2;
            ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,(long)iVar12 << 4);
            iVar12 = (p->pClauses).iTail;
            (p->pClauses).pData = ppGVar7;
          }
          (p->pClauses).iTail = iVar12 + 1;
          lVar8 = (long)iVar12;
        }
        goto LAB_006a0016;
      }
      iVar14 = (p->pClauses).iTail;
      if (iVar14 == (p->pClauses).nSize) {
        (p->pClauses).nSize = iVar14 * 2;
        ppGVar7 = (p->pClauses).pData;
        sVar11 = (long)iVar14 << 4;
        if (ppGVar7 == (Gia_Obj_t **)0x0) {
          ppGVar7 = (Gia_Obj_t **)malloc(sVar11);
          (p->pClauses).pData = ppGVar7;
          goto LAB_006a0295;
        }
        ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,sVar11);
        iVar14 = (p->pClauses).iTail;
        uVar5 = pGVar2->Value;
        (p->pClauses).pData = ppGVar7;
        iVar13 = iVar14 + 1;
        (p->pClauses).iTail = iVar13;
        ppGVar7[iVar14] = pGVar2 + iVar12;
        if (uVar5 == 0xffffffff) {
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x85,"Gia_Obj_t *Tas_VarReason1(Tas_Man_t *, Gia_Obj_t *)");
        }
      }
      else {
        ppGVar7 = (p->pClauses).pData;
LAB_006a0295:
        iVar13 = iVar14 + 1;
        (p->pClauses).iTail = iVar13;
        ppGVar7[iVar14] = pGVar2 + iVar12;
      }
      uVar5 = uVar5 * 3 + 2;
      if (((int)uVar5 < 0) || (p->vLevReas->nSize <= (int)uVar5)) {
LAB_006a03a0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar8 = (long)p->vLevReas->pArray[uVar5];
      if (lVar8 != 0) {
        if (iVar13 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar13 * 2;
          ppGVar7 = (p->pClauses).pData;
          sVar11 = (long)(iVar13 * 2) << 3;
          if (ppGVar7 == (Gia_Obj_t **)0x0) {
            ppGVar7 = (Gia_Obj_t **)malloc(sVar11);
          }
          else {
            ppGVar7 = (Gia_Obj_t **)realloc(ppGVar7,sVar11);
            iVar13 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar7;
        }
        else {
          ppGVar7 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar13 + 1;
        ppGVar7[iVar13] = pGVar2 + lVar8;
      }
    }
LAB_006a0338:
    lVar17 = lVar17 + 1;
    if ((p->pClauses).iTail <= lVar17) {
      if ((p->pClauses).pData[(p->pClauses).iHead] == (Gia_Obj_t *)0x0) {
        __assert_fail("pQue->pData[pQue->iHead] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                      ,0x339,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
      }
      (p->pClauses).iTail = local_48;
      pVVar9 = p->vTemp;
      if (0 < pVVar9->nSize) {
        lVar17 = 0;
        do {
          *(ulong *)pVVar9->pArray[lVar17] = *pVVar9->pArray[lVar17] & 0x7fffffffffffffff;
          lVar17 = lVar17 + 1;
          pVVar9 = p->vTemp;
        } while (lVar17 < pVVar9->nSize);
      }
      return;
    }
  } while( true );
}

Assistant:

static inline void Tas_ManDeriveReason( Tas_Man_t * p, int Level )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, j, iLitLevel, iLitLevel2;//, Id;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fPhase == 0 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Vec_PtrPush( p->vTemp, pObj );
        // bump activity
//        Id = Gia_ObjId( p->pAig, pObj );
//        if ( p->pActivity[Id] == 0.0 )
//            Vec_IntPush( p->vActiveVars, Id );
//        p->pActivity[Id] += p->Pars.VarInc;
        // check decision level
        iLitLevel = Tas_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        if ( Tas_VarHasReasonCls( p, pObj ) )
        {
            Tas_Cls_t * pCls = Tas_VarReasonCls( p, pObj );
            pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[0]) );
            assert( pReason == pObj );
            for ( j = 1; j < pCls->nLits; j++ )
            {
                pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[j]) );
                iLitLevel2 = Tas_VarDecLevel( p, pReason );
                assert( Tas_VarIsAssigned( pReason ) );
                assert( !Tas_LitIsTrue( pReason, pCls->pLits[j] ) );
                Tas_QuePush( pQue, pReason );
            }
        }
        else
        {
            pReason = Tas_VarReason0( p, pObj );
            if ( pReason == pObj ) // no reason
            {
                assert( pQue->pData[pQue->iHead] == NULL || Level == 0 );
                if ( pQue->pData[pQue->iHead] == NULL )
                    pQue->pData[pQue->iHead] = pObj;
                else
                    Tas_QuePush( pQue, pObj );
                continue;
            }
            Tas_QuePush( pQue, pReason );
            pReason = Tas_VarReason1( p, pObj );
            if ( pReason != pObj ) // second reason
                Tas_QuePush( pQue, pReason );
        }
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    if ( pQue->pData[pQue->iHead] == NULL )
        printf( "Tas_ManDeriveReason(): Failed to derive the clause!!!\n" );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fPhase = 0;
}